

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmConfigure(jx9_vm *pVm,sxi32 nOp,__va_list_tag *ap)

{
  int iVar1;
  uint uVar2;
  ProcConsumer p_Var3;
  void *pvVar4;
  sxu32 *psVar5;
  char *zSrc;
  jx9_hashmap *pData;
  sxu32 nSize;
  sxi32 sVar6;
  ushort **ppuVar7;
  bool bVar8;
  sxu32 *local_2a8;
  undefined8 *local_290;
  undefined8 *local_278;
  undefined8 *local_260;
  undefined8 *local_248;
  undefined8 *local_230;
  undefined8 *local_208;
  int *local_1f0;
  undefined8 *local_1d8;
  undefined8 *local_1c0;
  undefined8 *local_1a8;
  undefined8 *local_190;
  undefined8 *local_178;
  int *local_160;
  undefined8 *local_148;
  undefined8 *local_130;
  undefined8 *local_118;
  sxu32 local_f4;
  int nByte_1;
  char *zRequest;
  uint *pLen;
  void **ppOut;
  jx9_io_stream *pStream;
  jx9_value **ppValue;
  jx9_value *pValue_2;
  jx9_hashmap *pMap_1;
  char *zValue_1;
  jx9_value *pValue_1;
  jx9_hashmap *pMap;
  char *pcStack_98;
  int nLen;
  char *zValue;
  char *zKey;
  sxu32 nIdx;
  sxu32 nByte;
  jx9_value *pObj;
  SyHashEntry *pEntry;
  jx9_value *pValue;
  char *zName;
  sxu32 *pOut;
  byte *pbStack_50;
  int nDepth;
  SyString sPath;
  char *zPath;
  void *pUserData;
  ProcConsumer xConsumer;
  sxi32 rc;
  __va_list_tag *ap_local;
  sxi32 nOp_local;
  jx9_vm *pVm_local;
  
  xConsumer._4_4_ = 0;
  switch(nOp) {
  case 1:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_118 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_118 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_118 + 1;
    }
    p_Var3 = (ProcConsumer)*local_118;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_130 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_130 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_130 + 1;
    }
    pvVar4 = (void *)*local_130;
    (pVm->sVmConsumer).xConsumer = p_Var3;
    (pVm->sVmConsumer).pUserData = pvVar4;
    break;
  case 2:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_148 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_148 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_148 + 1;
    }
    pbStack_50 = (byte *)*local_148;
    sPath._8_8_ = pbStack_50;
    sPath.zString._0_4_ = SyStrlen((char *)pbStack_50);
    while( true ) {
      bVar8 = false;
      if ((sxu32)sPath.zString != 0) {
        bVar8 = pbStack_50[(sxu32)sPath.zString - 1] == 0x2f;
      }
      if (!bVar8) break;
      sPath.zString._0_4_ = (sxu32)sPath.zString - 1;
    }
    while( true ) {
      bVar8 = false;
      if (((sxu32)sPath.zString != 0) && (bVar8 = false, *pbStack_50 < 0xc0)) {
        ppuVar7 = __ctype_b_loc();
        bVar8 = ((*ppuVar7)[(int)(char)*pbStack_50] & 0x2000) != 0;
      }
      if (!bVar8) break;
      sPath.zString._0_4_ = (sxu32)sPath.zString - 1;
      pbStack_50 = pbStack_50 + 1;
    }
    while( true ) {
      bVar8 = false;
      if (((sxu32)sPath.zString != 0) &&
         (bVar8 = false, pbStack_50[(sxu32)sPath.zString - 1] < 0xc0)) {
        ppuVar7 = __ctype_b_loc();
        bVar8 = ((*ppuVar7)[(int)(char)pbStack_50[(sxu32)sPath.zString - 1]] & 0x2000) != 0;
      }
      if (!bVar8) break;
      sPath.zString._0_4_ = (sxu32)sPath.zString - 1;
    }
    if ((sxu32)sPath.zString != 0) {
      xConsumer._4_4_ = SySetPut(&pVm->aPaths,&stack0xffffffffffffffb0);
    }
    break;
  case 3:
    pVm->bErrReport = 1;
    break;
  case 4:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_160 = (int *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_160 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_160 + 2;
    }
    iVar1 = *local_160;
    if ((2 < iVar1) && (iVar1 < 0x400)) {
      pVm->nMaxDepth = iVar1;
    }
    break;
  case 5:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_178 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_178 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_178 + 1;
    }
    *(sxu32 *)*local_178 = pVm->nOutputLen;
    break;
  case 6:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_190 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_190 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_190 + 1;
    }
    pValue = (jx9_value *)*local_190;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_1a8 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_1a8 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_1a8 + 1;
    }
    pEntry = (SyHashEntry *)*local_1a8;
    zKey._4_4_ = SyStrlen((char *)pValue);
    pObj = (jx9_value *)SyHashGet(&pVm->hSuper,pValue,zKey._4_4_);
    if (pObj == (jx9_value *)0x0) {
      _nIdx = jx9VmReserveMemObj(pVm,(sxu32 *)&zKey);
      if (_nIdx == (jx9_value *)0x0) {
        xConsumer._4_4_ = -1;
      }
      else {
        jx9MemObjStore((jx9_value *)pEntry,_nIdx);
        xConsumer._4_4_ = SyHashInsert(&pVm->hSuper,pValue,zKey._4_4_,(void *)(ulong)(sxu32)zKey);
      }
    }
    else {
      zKey._0_4_ = (sxu32)pObj->pVm;
      _nIdx = (jx9_value *)SySetAt(&pVm->aMemObj,(sxu32)zKey);
      if (_nIdx != (jx9_value *)0x0) {
        jx9MemObjStore((jx9_value *)pEntry,_nIdx);
      }
    }
    break;
  case 7:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_290 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_290 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_290 + 1;
    }
    zSrc = (char *)*local_290;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_2a8 = (sxu32 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_2a8 = (sxu32 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_2a8 + 2;
    }
    local_f4 = *local_2a8;
    if ((zSrc == (char *)0x0) || (*zSrc == '\0')) {
      xConsumer._4_4_ = -3;
    }
    else {
      if ((int)local_f4 < 0) {
        local_f4 = SyStrlen(zSrc);
      }
      xConsumer._4_4_ = VmHttpProcessRequest(pVm,zSrc,local_f4);
    }
    break;
  case 8:
  case 9:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_1c0 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_1c0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_1c0 + 1;
    }
    zValue = (char *)*local_1c0;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_1d8 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_1d8 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_1d8 + 1;
    }
    pcStack_98 = (char *)*local_1d8;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_1f0 = (int *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_1f0 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_1f0 + 2;
    }
    pMap._4_4_ = *local_1f0;
    if (nOp == 9) {
      zValue_1 = (char *)VmExtractSuper(pVm,"_ENV",4);
    }
    else {
      zValue_1 = (char *)VmExtractSuper(pVm,"_SERVER",7);
    }
    if ((zValue_1 == (char *)0x0) || ((*(uint *)(zValue_1 + 8) & 0x40) == 0)) {
      xConsumer._4_4_ = -6;
    }
    else {
      pValue_1 = *(jx9_value **)zValue_1;
      xConsumer._4_4_ = VmHashmapInsert((jx9_hashmap *)pValue_1,zValue,-1,pcStack_98,pMap._4_4_);
    }
    break;
  case 10:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_230 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_230 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_230 + 1;
    }
    *(jx9_value **)*local_230 = &pVm->sExec;
    break;
  case 0xb:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_248 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_248 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_248 + 1;
    }
    ppOut = (void **)*local_248;
    if (((ppOut == (void **)0x0) || (*ppOut == (void *)0x0)) ||
       ((**ppOut == '\0' || ((ppOut[2] == (void *)0x0 || (ppOut[6] == (void *)0x0)))))) {
      xConsumer._4_4_ = -9;
    }
    else {
      if ((pVm->pDefStream == (jx9_io_stream *)0x0) &&
         (sVar6 = SyStrnicmp((char *)*ppOut,"file",4), sVar6 == 0)) {
        pVm->pDefStream = (jx9_io_stream *)ppOut;
      }
      xConsumer._4_4_ = SySetPut(&pVm->aIOstream,&ppOut);
    }
    break;
  case 0xc:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_208 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_208 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_208 + 1;
    }
    pMap_1 = (jx9_hashmap *)*local_208;
    ppValue = (jx9_value **)VmExtractSuper(pVm,"argv",4);
    if (((jx9_value *)ppValue == (jx9_value *)0x0) ||
       ((((jx9_value *)ppValue)->iFlags & 0x40U) == 0)) {
      xConsumer._4_4_ = -6;
    }
    else {
      pValue_2 = (jx9_value *)(((jx9_value *)ppValue)->x).pOther;
      xConsumer._4_4_ = VmHashmapInsert((jx9_hashmap *)pValue_2,(char *)0x0,0,(char *)pMap_1,-1);
      if (((xConsumer._4_4_ == 0) && (pMap_1 != (jx9_hashmap *)0x0)) &&
         (*(char *)&pMap_1->pVm != '\0')) {
        if (1 < (pValue_2->sBlob).mByte) {
          SyBlobAppend(&pVm->sArgv," ",1);
        }
        pData = pMap_1;
        nSize = SyStrlen((char *)pMap_1);
        SyBlobAppend(&pVm->sArgv,pData,nSize);
      }
    }
    break;
  case 0xd:
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_260 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_260 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_260 + 1;
    }
    local_260 = (undefined8 *)*local_260;
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_278 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_278 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_278 + 1;
    }
    psVar5 = (sxu32 *)*local_278;
    *local_260 = (pVm->sConsumer).pBlob;
    *psVar5 = (pVm->sConsumer).nByte;
    break;
  default:
    xConsumer._4_4_ = -0xd;
  }
  return xConsumer._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmConfigure(
	jx9_vm *pVm, /* Target VM */
	sxi32 nOp,   /* Configuration verb */
	va_list ap   /* Subsequent option arguments */
	)
{
	sxi32 rc = SXRET_OK;
	switch(nOp){
	case JX9_VM_CONFIG_OUTPUT: {
		ProcConsumer xConsumer = va_arg(ap, ProcConsumer);
		void *pUserData = va_arg(ap, void *);
		/* VM output consumer callback */
#ifdef UNTRUST
		if( xConsumer == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		/* Install the output consumer */
		pVm->sVmConsumer.xConsumer = xConsumer;
		pVm->sVmConsumer.pUserData = pUserData;
		break;
							   }
	case JX9_VM_CONFIG_IMPORT_PATH: {
		/* Import path */
		  const char *zPath;
		  SyString sPath;
		  zPath = va_arg(ap, const char *);
#if defined(UNTRUST)
		  if( zPath == 0 ){
			  rc = SXERR_EMPTY;
			  break;
		  }
#endif
		  SyStringInitFromBuf(&sPath, zPath, SyStrlen(zPath));
		  /* Remove trailing slashes and backslashes */
#ifdef __WINNT__
		  SyStringTrimTrailingChar(&sPath, '\\');
#endif
		  SyStringTrimTrailingChar(&sPath, '/');
		  /* Remove leading and trailing white spaces */
		  SyStringFullTrim(&sPath);
		  if( sPath.nByte > 0 ){
			  /* Store the path in the corresponding conatiner */
			  rc = SySetPut(&pVm->aPaths, (const void *)&sPath);
		  }
		  break;
									 }
	case JX9_VM_CONFIG_ERR_REPORT:
		/* Run-Time Error report */
		pVm->bErrReport = 1;
		break;
	case JX9_VM_CONFIG_RECURSION_DEPTH:{
		/* Recursion depth */
		int nDepth = va_arg(ap, int);
		if( nDepth > 2 && nDepth < 1024 ){
			pVm->nMaxDepth = nDepth;
		}
		break;
									   }
	case JX9_VM_OUTPUT_LENGTH: {
		/* VM output length in bytes */
		sxu32 *pOut = va_arg(ap, sxu32 *);
#ifdef UNTRUST
		if( pOut == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*pOut = pVm->nOutputLen;
		break;
							   }
	case JX9_VM_CONFIG_CREATE_VAR: {
		/* Create a new superglobal/global variable */
		const char *zName = va_arg(ap, const char *);
		jx9_value *pValue = va_arg(ap, jx9_value *);
		SyHashEntry *pEntry;
		jx9_value *pObj;
		sxu32 nByte;
		sxu32 nIdx; 
#ifdef UNTRUST
		if( SX_EMPTY_STR(zName) || pValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		nByte = SyStrlen(zName);
		/* Check if the superglobal is already installed */
		pEntry = SyHashGet(&pVm->hSuper, (const void *)zName, nByte);
		if( pEntry ){
			/* Variable already installed */
			nIdx = SX_PTR_TO_INT(pEntry->pUserData);
			/* Extract contents */
			pObj = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
			if( pObj ){
				/* Overwrite old contents */
				jx9MemObjStore(pValue, pObj);
			}
		}else{
			/* Install a new variable */
			pObj = jx9VmReserveMemObj(&(*pVm),&nIdx);
			if( pObj == 0 ){
				rc = SXERR_MEM;
				break;
			}
			/* Copy value */
			jx9MemObjStore(pValue, pObj);
			/* Install the superglobal */
			rc = SyHashInsert(&pVm->hSuper, (const void *)zName, nByte, SX_INT_TO_PTR(nIdx));
		}
		break;
									}
	case JX9_VM_CONFIG_SERVER_ATTR:
	case JX9_VM_CONFIG_ENV_ATTR:  {
		const char *zKey   = va_arg(ap, const char *);
		const char *zValue = va_arg(ap, const char *);
		int nLen = va_arg(ap, int);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		if( nOp == JX9_VM_CONFIG_ENV_ATTR ){
			/* Extract the $_ENV superglobal */
			pValue = VmExtractSuper(&(*pVm), "_ENV", sizeof("_ENV")-1);
		}else{
			/* Extract the $_SERVER superglobal */
			pValue = VmExtractSuper(&(*pVm), "_SERVER", sizeof("_SERVER")-1);
		}
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, zKey, -1, zValue, nLen);
		break;
								   }
	case JX9_VM_CONFIG_ARGV_ENTRY:{
		/* Script arguments */
		const char *zValue = va_arg(ap, const char *);
		jx9_hashmap *pMap;
		jx9_value *pValue;
		/* Extract the $argv array */
		pValue = VmExtractSuper(&(*pVm), "argv", sizeof("argv")-1);
		if( pValue == 0 || (pValue->iFlags & MEMOBJ_HASHMAP) == 0 ){
			/* No such entry */
			rc = SXERR_NOTFOUND;
			break;
		}
		/* Point to the hashmap */
		pMap = (jx9_hashmap *)pValue->x.pOther;
		/* Perform the insertion */
		rc = VmHashmapInsert(pMap, 0, 0, zValue,-1);
		if( rc == SXRET_OK && zValue && zValue[0] != 0 ){
			if( pMap->nEntry > 1 ){
				/* Append space separator first */
				SyBlobAppend(&pVm->sArgv, (const void *)" ", sizeof(char));
			}
			SyBlobAppend(&pVm->sArgv, (const void *)zValue,SyStrlen(zValue));
		}
		break;
								  }
	case JX9_VM_CONFIG_EXEC_VALUE: {
		/* Script return value */
		jx9_value **ppValue = va_arg(ap, jx9_value **);
#ifdef UNTRUST
		if( ppValue == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppValue = &pVm->sExec;
		break;
								   }
	case JX9_VM_CONFIG_IO_STREAM: {
		/* Register an IO stream device */
		const jx9_io_stream *pStream = va_arg(ap, const jx9_io_stream *);
		/* Make sure we are dealing with a valid IO stream */
		if( pStream == 0 || pStream->zName == 0 || pStream->zName[0] == 0 ||
			pStream->xOpen == 0 || pStream->xRead == 0 ){
				/* Invalid stream */
				rc = SXERR_INVALID;
				break;
		}
		if( pVm->pDefStream == 0 && SyStrnicmp(pStream->zName, "file", sizeof("file")-1) == 0 ){
			/* Make the 'file://' stream the defaut stream device */
			pVm->pDefStream = pStream;
		}
		/* Insert in the appropriate container */
		rc = SySetPut(&pVm->aIOstream, (const void *)&pStream);
		break;
								  }
	case JX9_VM_CONFIG_EXTRACT_OUTPUT: {
		/* Point to the VM internal output consumer buffer */
		const void **ppOut = va_arg(ap, const void **);
		unsigned int *pLen = va_arg(ap, unsigned int *);
#ifdef UNTRUST
		if( ppOut == 0 || pLen == 0 ){
			rc = SXERR_CORRUPT;
			break;
		}
#endif
		*ppOut = SyBlobData(&pVm->sConsumer);
		*pLen  = SyBlobLength(&pVm->sConsumer);
		break;
									   }
	case JX9_VM_CONFIG_HTTP_REQUEST:{
		/* Raw HTTP request*/
		const char *zRequest = va_arg(ap, const char *);
		int nByte = va_arg(ap, int);
		if( SX_EMPTY_STR(zRequest) ){
			rc = SXERR_EMPTY;
			break;
		}
		if( nByte < 0 ){
			/* Compute length automatically */
			nByte = (int)SyStrlen(zRequest);
		}
		/* Process the request */
		rc = VmHttpProcessRequest(&(*pVm), zRequest, nByte);
		break;
									}
	default:
		/* Unknown configuration option */
		rc = SXERR_UNKNOWN;
		break;
	}
	return rc;
}